

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdAddConfidentialTxOut
              (void *handle,char *tx_hex_string,char *asset_string,int64_t value_satoshi,
              char *value_commitment,char *address,char *direct_locking_script,char *nonce,
              char **tx_string)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  int64_t in_RCX;
  char *in_RDX;
  Amount *in_RSI;
  char *in_R8;
  string *in_R9;
  Amount AVar5;
  char *in_stack_00000008;
  char *in_stack_00000010;
  undefined8 *in_stack_00000018;
  CfdException *except;
  exception *std_except;
  Script script;
  Address addr;
  ElementsConfidentialAddress confidential_addr;
  ConfidentialNonce nonce_obj;
  ConfidentialAssetId asset_obj;
  ElementsAddressFactory address_factory;
  ConfidentialValue value;
  Amount amount;
  ConfidentialTransactionContext ctxc;
  string *in_stack_fffffffffffff6e8;
  ElementsConfidentialAddress *in_stack_fffffffffffff6f0;
  AddressFactory *in_stack_fffffffffffff6f8;
  string *in_stack_fffffffffffff700;
  CfdError in_stack_fffffffffffff70c;
  CfdException *in_stack_fffffffffffff710;
  undefined7 in_stack_fffffffffffff720;
  undefined1 in_stack_fffffffffffff727;
  string *in_stack_fffffffffffff750;
  ConfidentialAssetId *in_stack_fffffffffffff7b0;
  undefined7 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bf;
  ConfidentialTransactionContext *in_stack_fffffffffffff7c0;
  undefined1 remove_nonce;
  undefined7 in_stack_fffffffffffff7c8;
  Amount *value_00;
  ElementsConfidentialAddress *address_00;
  ConfidentialTransactionContext *in_stack_fffffffffffff7e0;
  string local_7d0;
  allocator local_7a9;
  string local_7a8;
  Script local_788;
  Script local_750;
  allocator local_711;
  string local_710 [32];
  Address local_6f0;
  allocator local_571;
  string local_570;
  ElementsConfidentialAddress local_550;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  ConfidentialNonce local_350;
  ConfidentialNonce local_328;
  allocator local_2f9;
  string local_2f8;
  ConfidentialAssetId local_2d8 [2];
  ConfidentialTransactionContext *local_288;
  undefined1 local_280;
  ConfidentialTransactionContext *local_278;
  undefined1 local_270;
  ConfidentialAssetId local_261;
  ConfidentialTransactionContext *local_218;
  undefined1 local_210;
  ConfidentialTransactionContext *local_208;
  undefined1 local_200;
  Amount local_1f8;
  undefined1 local_1e1 [33];
  ConfidentialTransaction local_1c0 [2];
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  string *local_38;
  char *local_30;
  int64_t local_28;
  char *local_20;
  Amount *local_18;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString((char *)local_18);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0xf5;
    local_60.funcname = "CfdAddConfidentialTxOut";
    cfd::core::logger::warn<>(&local_60,"tx is null or empty.");
    local_82 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. tx is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff710,in_stack_fffffffffffff70c,in_stack_fffffffffffff700);
    local_82 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000018 != (undefined8 *)0x0) {
    bVar1 = cfd::capi::IsEmptyString(local_20);
    if (bVar1) {
      local_e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                   ,0x2f);
      local_e0.filename = local_e0.filename + 1;
      local_e0.line = 0x101;
      local_e0.funcname = "CfdAddConfidentialTxOut";
      cfd::core::logger::warn<>(&local_e0,"asset is null or empty.");
      local_102 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,"Failed to parameter. asset is null or empty.",&local_101);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffff710,in_stack_fffffffffffff70c,in_stack_fffffffffffff700);
      local_102 = 0;
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    address_00 = (ElementsConfidentialAddress *)local_1e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1e1 + 1),(char *)local_18,(allocator *)address_00)
    ;
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8
              );
    std::__cxx11::string::~string((string *)(local_1e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1e1);
    cfd::core::Amount::Amount(&local_1f8);
    uVar2 = cfd::capi::IsEmptyString(local_30);
    if ((bool)uVar2) {
      AVar5 = cfd::core::Amount::CreateBySatoshiAmount(local_28);
      in_stack_fffffffffffff7c0 = (ConfidentialTransactionContext *)AVar5.amount_;
      in_stack_fffffffffffff7bf = AVar5.ignore_check_;
      value_00 = local_18;
      local_218 = in_stack_fffffffffffff7c0;
      local_210 = in_stack_fffffffffffff7bf;
      local_208 = in_stack_fffffffffffff7c0;
      local_200 = in_stack_fffffffffffff7bf;
      local_1f8.amount_ = (int64_t)in_stack_fffffffffffff7c0;
      local_1f8.ignore_check_ = (bool)in_stack_fffffffffffff7bf;
    }
    else {
      in_stack_fffffffffffff7b0 = &local_261;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)((long)&local_261._vptr_ConfidentialAssetId + 1),local_30,
                 (allocator *)in_stack_fffffffffffff7b0);
      cfd::core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&local_261.field_0x21,
                 (string *)((long)&local_261._vptr_ConfidentialAssetId + 1));
      std::__cxx11::string::~string((string *)((long)&local_261._vptr_ConfidentialAssetId + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      bVar1 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)&local_261.field_0x21);
      value_00 = local_18;
      if (!bVar1) {
        AVar5 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)&local_261.field_0x21);
        local_288 = (ConfidentialTransactionContext *)AVar5.amount_;
        local_280 = AVar5.ignore_check_;
        value_00 = local_18;
        local_278 = local_288;
        local_270 = local_280;
        local_1f8.amount_ = (int64_t)local_288;
        local_1f8.ignore_check_ = (bool)local_280;
      }
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5a3f12);
    }
    cfd::ElementsAddressFactory::ElementsAddressFactory
              ((ElementsAddressFactory *)
               CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f8,local_20,&local_2f9);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(local_2d8,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    cfd::core::ConfidentialNonce::ConfidentialNonce(&local_328);
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000010);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_370,in_stack_00000010,&local_371);
      cfd::core::ConfidentialNonce::ConfidentialNonce(&local_350,&local_370);
      cfd::core::ConfidentialNonce::operator=(&local_328,&local_350);
      cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5a404b);
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
    }
    bVar1 = cfd::capi::IsEmptyString((char *)local_38);
    if (bVar1) {
      bVar1 = cfd::capi::IsEmptyString(in_stack_00000008);
      if (bVar1) {
        bVar1 = cfd::core::operator>(&local_1f8,0);
        if (bVar1) {
          cfd::ConfidentialTransactionContext::UpdateFeeAmount
                    (in_stack_fffffffffffff7c0,
                     (Amount *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8),
                     in_stack_fffffffffffff7b0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_7a8,in_stack_00000008,&local_7a9);
        cfd::core::Script::Script(&local_788,&local_7a8);
        std::__cxx11::string::~string((string *)&local_7a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
        cfd::core::ConfidentialTransaction::AddTxOut
                  (local_1c0,&local_1f8,local_2d8,&local_788,&local_328);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff6f0);
      }
    }
    else {
      in_stack_fffffffffffff750 = local_38;
      std::allocator<char>::allocator();
      remove_nonce = (undefined1)((ulong)in_stack_fffffffffffff7c0 >> 0x38);
      std::__cxx11::string::string
                ((string *)&local_398,(char *)in_stack_fffffffffffff750,&local_399);
      bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator((allocator<char> *)&local_399);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_570,(char *)local_38,&local_571);
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_550,&local_570);
        std::__cxx11::string::~string((string *)&local_570);
        std::allocator<char>::~allocator((allocator<char> *)&local_571);
        cfd::ConfidentialTransactionContext::AddTxOut
                  (in_stack_fffffffffffff7e0,address_00,value_00,
                   (ConfidentialAssetId *)CONCAT17(uVar2,in_stack_fffffffffffff7c8),
                   (bool)remove_nonce);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  (in_stack_fffffffffffff6f0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_710,(char *)local_38,&local_711);
        cfd::AddressFactory::GetAddress
                  (in_stack_fffffffffffff6f8,(string *)in_stack_fffffffffffff6f0);
        std::__cxx11::string::~string(local_710);
        std::allocator<char>::~allocator((allocator<char> *)&local_711);
        cfd::core::Address::GetLockingScript(&local_750,&local_6f0);
        cfd::core::ConfidentialTransaction::AddTxOut
                  (local_1c0,&local_1f8,local_2d8,&local_750,&local_328);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff6f0);
        cfd::core::Address::~Address(&in_stack_fffffffffffff6f0->unblinded_address_);
      }
    }
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_
              (&local_7d0,&local_1c0[0].super_AbstractTransaction);
    pcVar4 = cfd::capi::CreateString(in_stack_fffffffffffff750);
    *in_stack_00000018 = pcVar4;
    std::__cxx11::string::~string((string *)&local_7d0);
    local_4 = 0;
    cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5a468e);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5a469b);
    cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5a46a8);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)in_stack_fffffffffffff6f0);
    return local_4;
  }
  local_a0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_a0.filename = local_a0.filename + 1;
  local_a0.line = 0xfb;
  local_a0.funcname = "CfdAddConfidentialTxOut";
  cfd::core::logger::warn<>(&local_a0,"tx output is null.");
  local_c2 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Failed to parameter. tx output is null.",&local_c1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff710,in_stack_fffffffffffff70c,in_stack_fffffffffffff700);
  local_c2 = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddConfidentialTxOut(
    void* handle, const char* tx_hex_string, const char* asset_string,
    int64_t value_satoshi, const char* value_commitment, const char* address,
    const char* direct_locking_script, const char* nonce, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }

    ConfidentialTransactionContext ctxc(tx_hex_string);

    Amount amount;
    if (IsEmptyString(value_commitment)) {
      amount = Amount::CreateBySatoshiAmount(value_satoshi);
    } else {
      ConfidentialValue value = ConfidentialValue(value_commitment);
      // unconfidential only
      if (!value.HasBlinding()) amount = value.GetAmount();
    }

    // add TxOut
    ElementsAddressFactory address_factory;
    ConfidentialAssetId asset_obj(asset_string);
    ConfidentialNonce nonce_obj;
    if (!IsEmptyString(nonce)) {
      nonce_obj = ConfidentialNonce(nonce);
    }
    if (!IsEmptyString(address)) {
      // const std::string addr(address);
      if (ElementsConfidentialAddress::IsConfidentialAddress(address)) {
        ElementsConfidentialAddress confidential_addr(address);
        ctxc.AddTxOut(confidential_addr, amount, asset_obj, false);
      } else {
        Address addr = address_factory.GetAddress(address);
        ctxc.AddTxOut(amount, asset_obj, addr.GetLockingScript(), nonce_obj);
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      Script script(direct_locking_script);
      ctxc.AddTxOut(amount, asset_obj, script, nonce_obj);
    } else if (amount > 0) {
      // fee
      ctxc.UpdateFeeAmount(amount, asset_obj);
    }

    *tx_string = CreateString(ctxc.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}